

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_move_32_pi_pi(void)

{
  uint uVar1;
  uint value;
  ulong uVar2;
  
  uVar1 = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8];
  m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] = uVar1 + 4;
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar1 = pmmu_translate_addr(uVar1);
  }
  value = m68k_read_memory_32(uVar1 & m68ki_cpu.address_mask);
  uVar2 = (ulong)(m68ki_cpu.ir >> 7 & 0x1c);
  uVar1 = *(uint *)((long)m68ki_cpu.dar + uVar2 + 0x20);
  *(uint *)((long)m68ki_cpu.dar + uVar2 + 0x20) = uVar1 + 4;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar1 = pmmu_translate_addr(uVar1);
  }
  m68k_write_memory_32(uVar1 & m68ki_cpu.address_mask,value);
  m68ki_cpu.n_flag = value >> 0x18;
  m68ki_cpu.not_z_flag = value;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  return;
}

Assistant:

static void m68k_op_move_32_pi_pi(void)
{
	uint res = OPER_AY_PI_32();
	uint ea = EA_AX_PI_32();

	m68ki_write_32(ea, res);

	FLAG_N = NFLAG_32(res);
	FLAG_Z = res;
	FLAG_V = VFLAG_CLEAR;
	FLAG_C = CFLAG_CLEAR;
}